

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O3

int aead_aes256gcm_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  aesgcm_context_t *ctx_1;
  code *pcVar4;
  
  ctx->dispose_crypto = aesgcm_dispose_crypto;
  if (is_enc == 0) {
    pcVar1 = aesgcm_decrypt;
    pcVar2 = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    pcVar4 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    pcVar3 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
  }
  else {
    pcVar3 = aesgcm_encrypt_final;
    pcVar4 = aesgcm_encrypt_update;
    pcVar2 = aesgcm_encrypt_init;
    pcVar1 = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_void_ptr_void_ptr_size_t
              *)0x0;
  }
  ctx->do_encrypt_init = pcVar2;
  ctx->do_encrypt_update = pcVar4;
  ctx->do_encrypt_final = pcVar3;
  ctx->do_decrypt = pcVar1;
  cf_aes_init((cf_aes_context *)(ctx + 1),(uint8_t *)key,0x20);
  return 0;
}

Assistant:

static int aead_aes256gcm_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key)
{
    return aead_aesgcm_setup_crypto(ctx, is_enc, key, PTLS_AES256_KEY_SIZE);
}